

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::reflection_ssbo_instance_name_is_significant(Compiler *this)

{
  byte bVar1;
  anon_class_24_3_728720a5 local_70;
  bool local_51;
  undefined1 local_50 [7];
  bool aliased_ssbo_types;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ssbo_type_ids;
  Compiler *this_local;
  
  if (((this->ir).source.known & 1U) == 0) {
    ssbo_type_ids._M_h._M_single_bucket = (__node_base_ptr)this;
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_50);
    local_51 = false;
    local_70.aliased_ssbo_types = &local_51;
    local_70.this = this;
    local_70.ssbo_type_ids =
         (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *)local_50;
    ParsedIR::
    for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::Compiler::reflection_ssbo_instance_name_is_significant()const::__0>
              (&this->ir,&local_70);
    bVar1 = local_51;
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_50);
  }
  else {
    bVar1 = (this->ir).source.hlsl;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool Compiler::reflection_ssbo_instance_name_is_significant() const
{
	if (ir.source.known)
	{
		// UAVs from HLSL source tend to be declared in a way where the type is reused
		// but the instance name is significant, and that's the name we should report.
		// For GLSL, SSBOs each have their own block type as that's how GLSL is written.
		return ir.source.hlsl;
	}

	unordered_set<uint32_t> ssbo_type_ids;
	bool aliased_ssbo_types = false;

	// If we don't have any OpSource information, we need to perform some shaky heuristics.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if (!type.pointer || var.storage == StorageClassFunction)
			return;

		bool ssbo = var.storage == StorageClassStorageBuffer ||
		            (var.storage == StorageClassUniform && has_decoration(type.self, DecorationBufferBlock));

		if (ssbo)
		{
			if (ssbo_type_ids.count(type.self))
				aliased_ssbo_types = true;
			else
				ssbo_type_ids.insert(type.self);
		}
	});

	// If the block name is aliased, assume we have HLSL-style UAV declarations.
	return aliased_ssbo_types;
}